

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.cpp
# Opt level: O0

ColumnRef __thiscall clickhouse::ColumnNullable::Slice(ColumnNullable *this,size_t begin,size_t len)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ColumnRef CVar3;
  element_type *this_00;
  shared_ptr<clickhouse::Column> *in_stack_ffffffffffffffb0;
  shared_ptr<clickhouse::Column> *in_stack_ffffffffffffffb8;
  undefined1 local_40 [32];
  undefined8 local_20;
  undefined8 local_18;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  peVar1 = std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2128d7);
  (*peVar1->_vptr_Column[7])(local_40,peVar1,local_18,local_20);
  peVar2 = std::
           __shared_ptr_access<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x212900);
  (*(peVar2->super_Column)._vptr_Column[7])(&stack0xffffffffffffffb0,peVar2,local_18,local_20);
  std::
  make_shared<clickhouse::ColumnNullable,std::shared_ptr<clickhouse::Column>,std::shared_ptr<clickhouse::Column>>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnNullable,void>
            ((shared_ptr<clickhouse::Column> *)this_00,
             (shared_ptr<clickhouse::ColumnNullable> *)in_RDI);
  std::shared_ptr<clickhouse::ColumnNullable>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnNullable> *)0x21294b);
  std::shared_ptr<clickhouse::Column>::~shared_ptr((shared_ptr<clickhouse::Column> *)0x212955);
  std::shared_ptr<clickhouse::Column>::~shared_ptr((shared_ptr<clickhouse::Column> *)0x21295f);
  CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (ColumnRef)CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnNullable::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnNullable>(nested_->Slice(begin, len), nulls_->Slice(begin, len));
}